

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::FunctionStmtBlock::create_function_handler
          (FunctionStmtBlock *this,uint32_t width,bool is_signed)

{
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar2 [16];
  string_view format_str;
  format_args args;
  bool local_140 [4];
  PortType local_13c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_114 [4];
  shared_ptr<kratos::Port> local_110;
  undefined1 local_fa;
  allocator<const_kratos::IRNode_*> local_f9;
  element_type *local_f8;
  element_type **local_f0;
  size_type local_e8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_e0;
  string local_b8;
  undefined1 local_95;
  uint32_t local_94;
  bool is_signed_local;
  FunctionStmtBlock *pFStack_90;
  uint32_t width_local;
  FunctionStmtBlock *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_95 = is_signed;
  local_94 = width;
  pFStack_90 = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->function_handler_);
  if (!bVar1) {
    local_114 = (undefined1  [4])0x0;
    std::operator+(&local_138,&this->function_name_,"_return");
    local_13c = Clock;
    local_140[0] = false;
    local_140[1] = false;
    local_140[2] = false;
    local_140[3] = false;
    std::
    make_shared<kratos::Port,kratos::Generator*&,kratos::PortDirection,std::__cxx11::string,unsigned_int&,int,kratos::PortType,bool&>
              ((Generator **)(local_114 + 4),(PortDirection *)&this->parent_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_114,
               (uint *)&local_138,(int *)&local_94,&local_13c,local_140);
    std::shared_ptr<kratos::Var>::operator=
              (&this->function_handler_,(shared_ptr<kratos::Port> *)(local_114 + 4));
    std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)(local_114 + 4));
    std::__cxx11::string::~string((string *)&local_138);
    return;
  }
  local_fa = '\x01';
  auVar2 = __cxa_allocate_exception(0x10);
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&this->function_name_;
  local_38 = &local_b8;
  local_40 = "{0} already has a function handler";
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string&,char[35],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"{0} already has a function handler",(v7 *)vargs,auVar2._8_8_,
                  (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                  "{0} already has a function handler");
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  format_str.size_ = (size_t)this_local;
  format_str.data_ = (char *)local_78.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_80.values_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)local_78.data_,format_str,args);
  local_f8 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->function_handler_).
                         super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  local_f0 = &local_f8;
  local_e8 = 1;
  std::allocator<const_kratos::IRNode_*>::allocator(&local_f9);
  __l._M_len = local_e8;
  __l._M_array = (iterator)local_f0;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_e0,__l,&local_f9);
  VarException::VarException(auVar2._0_8_,&local_b8,&local_e0);
  local_fa = '\0';
  __cxa_throw(auVar2._0_8_,&VarException::typeinfo,VarException::~VarException);
}

Assistant:

void FunctionStmtBlock::create_function_handler(uint32_t width, bool is_signed) {
    if (function_handler_) {
        throw VarException(::format("{0} already has a function handler", function_name_),
                           {function_handler_.get()});
    }
    function_handler_ =
        std::make_shared<Port>(parent_, PortDirection::In, function_name_ + "_return", width, 1,
                               PortType::Data, is_signed);
}